

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr *pPVar1;
  PgHdr *pPVar2;
  long lVar3;
  PgHdr *local_118 [32];
  
  pPVar1 = pCache->pDirty;
  pPVar2 = pPVar1;
  while (pPVar2 != (PgHdr *)0x0) {
    pPVar2->pDirty = pPVar2->pDirtyNext;
    pPVar2 = pPVar2->pDirtyNext;
  }
  memset(local_118,0,0x100);
LAB_00136e80:
  do {
    if (pPVar1 == (PgHdr *)0x0) {
      for (lVar3 = 1; lVar3 != 0x20; lVar3 = lVar3 + 1) {
        pPVar1 = local_118[lVar3];
        pPVar2 = local_118[0];
        if ((pPVar1 != (PgHdr *)0x0) && (pPVar2 = pPVar1, local_118[0] != (PgHdr *)0x0)) {
          pPVar2 = pcacheMergeDirtyList(local_118[0],pPVar1);
        }
        local_118[0] = pPVar2;
      }
      return local_118[0];
    }
    pPVar2 = pPVar1->pDirty;
    pPVar1->pDirty = (PgHdr *)0x0;
    for (lVar3 = 0; lVar3 != 0x1f; lVar3 = lVar3 + 1) {
      if (local_118[lVar3] == (PgHdr *)0x0) {
        local_118[lVar3] = pPVar1;
        pPVar1 = pPVar2;
        goto LAB_00136e80;
      }
      pPVar1 = pcacheMergeDirtyList(local_118[lVar3],pPVar1);
      local_118[lVar3] = (PgHdr *)0x0;
    }
    local_118[0x1f] = pcacheMergeDirtyList(local_118[0x1f],pPVar1);
    pPVar1 = pPVar2;
  } while( true );
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}